

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void find_rectangles(Mat *image,
                    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *rectangles)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  double dVar5;
  double local_6e0;
  byte local_6b9;
  Point_<int> local_6a0;
  Point_<int> local_698;
  Point_<int> local_690;
  double local_688;
  double cosine;
  double dStack_678;
  int j;
  double maxCosine;
  Mat local_668;
  _InputArray local_608;
  byte local_5ea;
  byte local_5e9;
  Mat local_5e8;
  _InputArray local_588;
  Mat local_570;
  _InputArray local_510;
  _OutputArray local_4f8;
  Mat local_4e0;
  _InputArray local_480;
  ulong local_468;
  size_t i;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> approx;
  _OutputArray local_440;
  _InputArray local_428;
  Mat local_410 [3];
  undefined1 local_2b0 [32];
  Point_<int> local_290;
  Mat local_288;
  _InputArray local_228;
  _OutputArray local_210;
  _InputArray local_1f8;
  _OutputArray local_1e0;
  _InputArray local_1c8;
  int local_1ac;
  undefined4 local_1a8;
  int l;
  int threshold_level;
  int ch [2];
  int c;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Mat gray;
  undefined1 local_118 [8];
  Mat gray0;
  _InputArray local_90;
  undefined1 local_78 [8];
  Mat blurred;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *rectangles_local;
  Mat *image_local;
  
  blurred.step.buf[1] = (size_t)rectangles;
  cv::Mat::Mat((Mat *)local_78,image);
  cv::_InputArray::_InputArray(&local_90,image);
  cv::_OutputArray::_OutputArray((_OutputArray *)(gray0.step.buf + 1),(Mat *)local_78);
  cv::medianBlur(&local_90,(_OutputArray *)(gray0.step.buf + 1),9);
  cv::_OutputArray::~_OutputArray((_OutputArray *)(gray0.step.buf + 1));
  cv::_InputArray::~_InputArray(&local_90);
  cv::MatSize::operator()((MatSize *)(gray.step.buf + 1));
  cv::Mat::Mat((Mat *)local_118,gray.step.buf + 1,0);
  cv::Mat::Mat((Mat *)&contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)(ch + 1));
  for (ch[0] = 0; ch[0] < 3; ch[0] = ch[0] + 1) {
    l = ch[0];
    threshold_level = 0;
    cv::mixChannels((Mat *)local_78,1,(Mat *)local_118,1,&l,1);
    local_1a8 = 2;
    for (local_1ac = 0; local_1ac < 2; local_1ac = local_1ac + 1) {
      if (local_1ac == 0) {
        cv::_InputArray::_InputArray(&local_1c8,(Mat *)local_118);
        cv::_OutputArray::_OutputArray
                  (&local_1e0,
                   (Mat *)&contours.
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::Canny(&local_1c8,&local_1e0,10.0,20.0,3,false);
        cv::_OutputArray::~_OutputArray(&local_1e0);
        cv::_InputArray::~_InputArray(&local_1c8);
        cv::_InputArray::_InputArray
                  (&local_1f8,
                   (Mat *)&contours.
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::_OutputArray::_OutputArray
                  (&local_210,
                   (Mat *)&contours.
                           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::Mat::Mat(&local_288);
        cv::_InputArray::_InputArray(&local_228,&local_288);
        cv::Point_<int>::Point_(&local_290,-1,-1);
        cv::morphologyDefaultBorderValue();
        cv::dilate(&local_1f8,&local_210,&local_228,&local_290,1,0,local_2b0);
        cv::_InputArray::~_InputArray(&local_228);
        cv::Mat::~Mat(&local_288);
        cv::_OutputArray::~_OutputArray(&local_210);
        cv::_InputArray::~_InputArray(&local_1f8);
      }
      else {
        cv::operator>=(local_410,
                       (double)((local_1ac * 0xff + 0xff) - (local_1ac * 0xff + 0xff >> 0x1f) >> 1))
        ;
        cv::Mat::operator=((Mat *)&contours.
                                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (MatExpr *)local_410);
        cv::MatExpr::~MatExpr((MatExpr *)local_410);
      }
      cv::_InputArray::_InputArray
                (&local_428,
                 (Mat *)&contours.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::_OutputArray<cv::Point_<int>>
                (&local_440,
                 (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  *)(ch + 1));
      cv::Point_<int>::Point_
                ((Point_<int> *)
                 &approx.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::findContours(&local_428,&local_440,1,2,
                       &approx.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::~_OutputArray(&local_440);
      cv::_InputArray::~_InputArray(&local_428);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i);
      for (local_468 = 0; uVar1 = local_468,
          sVar2 = std::
                  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ::size((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          *)(ch + 1)), uVar1 < sVar2; local_468 = local_468 + 1) {
        pvVar3 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               *)(ch + 1),local_468);
        cv::Mat::Mat<cv::Point_<int>>(&local_4e0,pvVar3,false);
        cv::_InputArray::_InputArray(&local_480,&local_4e0);
        cv::_OutputArray::_OutputArray<cv::Point_<int>>
                  (&local_4f8,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i);
        pvVar3 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[]((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               *)(ch + 1),local_468);
        cv::Mat::Mat<cv::Point_<int>>(&local_570,pvVar3,false);
        cv::_InputArray::_InputArray(&local_510,&local_570);
        dVar5 = (double)cv::arcLength(&local_510,true);
        cv::approxPolyDP(&local_480,&local_4f8,dVar5 * 0.02,true);
        cv::_InputArray::~_InputArray(&local_510);
        cv::Mat::~Mat(&local_570);
        cv::_OutputArray::~_OutputArray(&local_4f8);
        cv::_InputArray::~_InputArray(&local_480);
        cv::Mat::~Mat(&local_4e0);
        sVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i);
        local_5e9 = 0;
        local_5ea = 0;
        maxCosine._7_1_ = 0;
        maxCosine._6_1_ = 0;
        local_6b9 = 0;
        if (sVar2 == 4) {
          cv::Mat::Mat<cv::Point_<int>>
                    (&local_5e8,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i,
                     false);
          local_5e9 = 1;
          cv::_InputArray::_InputArray(&local_588,&local_5e8);
          local_5ea = 1;
          dVar5 = (double)cv::contourArea(&local_588,false);
          local_6b9 = 0;
          if (1000.0 < ABS(dVar5)) {
            cv::Mat::Mat<cv::Point_<int>>
                      (&local_668,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i,
                       false);
            maxCosine._7_1_ = 1;
            cv::_InputArray::_InputArray(&local_608,&local_668);
            maxCosine._6_1_ = 1;
            local_6b9 = cv::isContourConvex(&local_608);
          }
        }
        if ((maxCosine._6_1_ & 1) != 0) {
          cv::_InputArray::~_InputArray(&local_608);
        }
        if ((maxCosine._7_1_ & 1) != 0) {
          cv::Mat::~Mat(&local_668);
        }
        if ((local_5ea & 1) != 0) {
          cv::_InputArray::~_InputArray(&local_588);
        }
        if ((local_5e9 & 1) != 0) {
          cv::Mat::~Mat(&local_5e8);
        }
        if ((local_6b9 & 1) != 0) {
          dStack_678 = 0.0;
          for (cosine._4_4_ = 2; cosine._4_4_ < 5; cosine._4_4_ = cosine._4_4_ + 1) {
            pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                               ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i,
                                (long)(cosine._4_4_ % 4));
            cv::Point_<int>::Point_(&local_690,pvVar4);
            pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                               ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i,
                                (long)(cosine._4_4_ + -2));
            cv::Point_<int>::Point_(&local_698,pvVar4);
            pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                               ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i,
                                (long)(cosine._4_4_ + -1));
            cv::Point_<int>::Point_(&local_6a0,pvVar4);
            local_688 = angle(&local_690,&local_698,&local_6a0);
            local_688 = ABS(local_688);
            local_6e0 = local_688;
            if (local_688 <= dStack_678) {
              local_6e0 = dStack_678;
            }
            dStack_678 = local_6e0;
          }
          if (dStack_678 < 0.3) {
            std::
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ::push_back((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         *)blurred.step.buf[1],(value_type *)&i);
          }
        }
      }
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&i);
    }
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)(ch + 1));
  cv::Mat::~Mat((Mat *)&contours.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)local_118);
  cv::Mat::~Mat((Mat *)local_78);
  return;
}

Assistant:

void find_rectangles(Mat& image, vector<vector<Point> >& rectangles)
{
    // blur will enhance edge detection
    Mat blurred(image);
    medianBlur(image, blurred, 9);

    Mat gray0(blurred.size(), CV_8U), gray;
    vector<vector<Point>> contours;

    // find rectangles in every color plane of the image
    for (int c = 0; c < 3; c++)
    {
        int ch[] = {c, 0};
        mixChannels(&blurred, 1, &gray0, 1, ch, 1);

        // try several threshold levels
        const int threshold_level = 2;
        for (int l = 0; l < threshold_level; l++)
        {
            // Use Canny instead of zero threshold level!
            // Canny helps to catch rectangles with gradient shading
            if (l == 0)
            {
                Canny(gray0, gray, 10, 20, 3); //
                // Dilate helps to remove potential holes between edge segments
                dilate(gray, gray, Mat(), Point(-1,-1));
            }
            else
            {
                    gray = gray0 >= (l+1) * 255 / threshold_level;
            }

            // Find contours and store them in a list
            findContours(gray, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

            // Test contours
            vector<Point> approx;
            for (size_t i = 0; i < contours.size(); i++)
            {
                    // approximate contour with accuracy proportional
                    // to the contour perimeter
                    approxPolyDP(Mat(contours[i]), approx, arcLength(Mat(contours[i]), true)*0.02, true);

                    // Note: absolute value of an area is used because
                    // area may be positive or negative - in accordance with the
                    // contour orientation
                    if (approx.size() == 4 &&
                            fabs(contourArea(Mat(approx))) > 1000 &&
                            isContourConvex(Mat(approx)))
                    {
                            double maxCosine = 0;

                            for (int j = 2; j < 5; j++)
                            {
                                    double cosine = fabs(angle(approx[j%4], approx[j-2], approx[j-1]));
                                    maxCosine = MAX(maxCosine, cosine);
                            }

                            if (maxCosine < 0.3)
                              rectangles.push_back(approx);
                    }
            }
        }
    }
}